

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O0

void us_internal_timer_sweep(us_loop_t *loop)

{
  long lVar1;
  long lVar2;
  short sVar3;
  long in_RDI;
  us_socket_t *s;
  us_socket_context_t *context;
  us_internal_loop_data_t *loop_data;
  
  *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(in_RDI + 0x18);
  while (*(long *)(in_RDI + 0x20) != 0) {
    lVar1 = *(long *)(in_RDI + 0x20);
    *(undefined8 *)(lVar1 + 0x10) = *(undefined8 *)(lVar1 + 8);
    while (*(long *)(lVar1 + 0x10) != 0) {
      lVar2 = *(long *)(lVar1 + 0x10);
      if ((*(short *)(lVar2 + 0x28) == 0) ||
         (sVar3 = *(short *)(lVar2 + 0x28) + -1, *(short *)(lVar2 + 0x28) = sVar3, sVar3 != 0)) {
        *(undefined8 *)(lVar1 + 0x10) = *(undefined8 *)(lVar2 + 0x20);
      }
      else {
        (**(code **)(lVar1 + 0x48))(lVar2);
        if (lVar2 == *(long *)(lVar1 + 0x10)) {
          *(undefined8 *)(lVar1 + 0x10) = *(undefined8 *)(lVar2 + 0x20);
        }
      }
    }
    *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)(*(long *)(in_RDI + 0x20) + 0x20);
  }
  return;
}

Assistant:

void us_internal_timer_sweep(struct us_loop_t *loop) {
    struct us_internal_loop_data_t *loop_data = &loop->data;
    for (loop_data->iterator = loop_data->head; loop_data->iterator; loop_data->iterator = loop_data->iterator->next) {

        struct us_socket_context_t *context = loop_data->iterator;
        for (context->iterator = context->head; context->iterator; ) {

            struct us_socket_t *s = context->iterator;
            if (s->timeout && --(s->timeout) == 0) {

                context->on_socket_timeout(s);

                /* Check for unlink / link */
                if (s == context->iterator) {
                    context->iterator = s->next;
                }
            } else {
                context->iterator = s->next;
            }
        }
    }
}